

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_append_time_t(void)

{
  char cVar1;
  bson_t *a;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  cVar1 = bson_append_time_t(a,"time_t",0xffffffffffffffff,0x499602d2);
  if (cVar1 != '\0') {
    b = get_bson("test26.bson");
    BSON_ASSERT_BSON_EQUAL(a,b);
    bson_destroy(a);
    bson_destroy(b);
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          0x14e,"test_bson_append_time_t","bson_append_time_t (b, \"time_t\", -1, t)");
  abort();
}

Assistant:

static void
test_bson_append_time_t (void)
{
   bson_t *b;
   bson_t *b2;
   time_t t;

   t = 1234567890;

   b = bson_new ();
   BSON_ASSERT (bson_append_time_t (b, "time_t", -1, t));
   b2 = get_bson ("test26.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}